

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IO_Report_PDU::Decode(IO_Report_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  StdVarPtr local_70;
  ushort local_58;
  undefined1 local_55;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IO_Report_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vStdVarRecs);
  IO_Header::Decode(&this->super_IO_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&this->m_ui16SimSrc);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8RptTyp);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_AtkEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_TgtEntityID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  KDataStream::operator>>(pKVar2,&this->m_ui16NumStdVarRec);
  for (local_58 = 0; local_58 < this->m_ui16NumStdVarRec; local_58 = local_58 + 1) {
    DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable(&local_70,pKStack_18);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::push_back(&this->m_vStdVarRecs,&local_70);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_70);
  }
  return;
}

Assistant:

void IO_Report_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IO_REPORT_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

    IO_Header::Decode( stream, ignoreHeader );

    stream >> m_ui16SimSrc
           >> m_ui8RptTyp
           >> m_ui8Padding
           >> KDIS_STREAM m_AtkEntityID
           >> KDIS_STREAM m_TgtEntityID
           >> m_ui32Padding
           >> m_ui16NumStdVarRec;

    // Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumStdVarRec; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}